

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O2

char * blogc_get_filename(char *f)

{
  char cVar1;
  byte bVar2;
  char *__s;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  
  if ((f == (char *)0x0) || (*f == '\0')) {
    return (char *)0x0;
  }
  __s = bc_strdup(f);
  uVar3 = strlen(__s);
  bVar2 = 0;
  do {
    pcVar4 = __s;
    if ((int)uVar3 < 0) {
LAB_00102eec:
      pcVar4 = bc_strdup(pcVar4);
      free(__s);
      return pcVar4;
    }
    uVar5 = uVar3 & 0xffffffff;
    cVar1 = __s[uVar5];
    if ((bool)(cVar1 != '.' | bVar2)) {
      if ((cVar1 == '\\') || (cVar1 == '/')) {
        pcVar4 = __s + uVar5 + 1;
        goto LAB_00102eec;
      }
    }
    else {
      __s[uVar5] = '\0';
      bVar2 = 1;
    }
    uVar3 = (ulong)((int)uVar3 - 1);
  } while( true );
}

Assistant:

char*
blogc_get_filename(const char *f)
{
    if (f == NULL)
        return NULL;

    if (strlen(f) == 0)
        return NULL;

    char *filename = bc_strdup(f);

    // keep a pointer to original string
    char *tmp = filename;

    bool removed_dot = false;
    for (int i = strlen(tmp); i >= 0 ; i--) {

        // remove last extension
        if (!removed_dot && tmp[i] == '.') {
            tmp[i] = '\0';
            removed_dot = true;
            continue;
        }

        if (tmp[i] == '/' || tmp[i] == '\\') {
            tmp += i + 1;
            break;
        }
    }

    char *final_filename = bc_strdup(tmp);
    free(filename);

    return final_filename;
}